

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O0

_Bool monster_attack_monster(monster *mon,monster *t_mon)

{
  random_value *prVar1;
  loc_conflict grid_00;
  blow_effect *effect_00;
  blow_method_conflict *pbVar2;
  bool bVar3;
  random_value v;
  random_value dice_00;
  _Bool _Var4;
  int iVar5;
  wchar_t to_hit;
  uint32_t uVar6;
  monster_lore_conflict *lore_00;
  monster *pmVar7;
  source sVar8;
  source origin;
  wchar_t local_184;
  char local_16d [5];
  wchar_t wStack_168;
  char dice_1 [5];
  wchar_t tmp;
  wchar_t amt;
  melee_effect_handler_context_t context;
  melee_effect_handler_f effect_handler;
  random_value dice;
  blow_method *method;
  blow_effect *effect;
  byte local_e6;
  _Bool do_stun;
  wchar_t damage;
  _Bool obvious;
  _Bool visible;
  loc_conflict grid;
  _Bool blinked;
  char t_name [80];
  char m_name [80];
  int local_30;
  wchar_t ap_cnt;
  wchar_t rlev;
  monster_lore *lore;
  monster *t_mon_local;
  monster *mon_local;
  
  lore_00 = get_lore(mon->race);
  if (mon->race->level < L'\x01') {
    local_184 = L'\x01';
  }
  else {
    local_184 = mon->race->level;
  }
  grid.x._3_1_ = 0;
  _Var4 = flag_has_dbg(mon->race->flags,0xb,0x14,"mon->race->flags","RF_NEVER_BLOW");
  if (_Var4) {
    mon_local._7_1_ = false;
  }
  else {
    monster_desc(t_name + 0x48,0x50,mon,L'̔');
    monster_desc((char *)&grid.y,0x50,t_mon,L'\x15');
    for (local_30 = 0; local_30 < (int)(uint)z_info->mon_blows_max; local_30 = local_30 + 1) {
      grid_00 = t_mon->grid;
      _Var4 = monster_is_visible(mon);
      bVar3 = true;
      if (!_Var4) {
        bVar3 = L'\0' < mon->race->light;
      }
      local_e6 = 0;
      effect._4_4_ = L'\0';
      effect_00 = (blow_effect *)mon->race->blow[local_30].effect;
      pbVar2 = mon->race->blow[local_30].method;
      prVar1 = &mon->race->blow[local_30].dice;
      dice_00 = *prVar1;
      v = *prVar1;
      if (pbVar2 == (blow_method_conflict *)0x0) break;
      if (effect_00 == (blow_effect *)0x0) {
        __assert_fail("effect",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-attack.c"
                      ,799,"_Bool monster_attack_monster(struct monster *, struct monster *)");
      }
      iVar5 = strcmp(effect_00->name,"NONE");
      if (iVar5 == 0) {
LAB_00188f8b:
        _Var4 = pbVar2->stun;
        local_e6 = 1;
        effect._4_4_ = randcalc(v,local_184,RANDOMISE);
        if (mon->m_timed[1] != 0) {
          effect._4_4_ = (effect._4_4_ * 0x4b) / 100;
        }
        context.m_name = (char *)melee_handler_for_blow_effect(effect_00->name);
        if ((melee_effect_handler_f)context.m_name == (melee_effect_handler_f)0x0) {
          msg("ERROR: Effect handler not found for %s.",effect_00->name);
        }
        else {
          _tmp = (player *)0x0;
          context.t_mon._0_4_ = local_184;
          context.method._0_4_ = t_mon->race->ac;
          context.ac = L'\0';
          context._44_4_ = 0;
          context.ddesc._0_1_ = 1;
          context.ddesc._1_1_ = grid.x._3_1_ & 1;
          context.ddesc._4_4_ = effect._4_4_;
          context._56_8_ = t_name + 0x48;
          context.p = (player *)mon;
          context.mon = t_mon;
          context._24_8_ = pbVar2;
          (*(code *)context.m_name)((melee_effect_handler_context_t *)&tmp);
          local_e6 = (byte)context.ddesc & 1;
          grid.x._3_1_ = context.ddesc._1_1_ & 1;
          effect._4_4_ = context.ddesc._4_4_;
        }
        if (((_Var4 & 1U) != 0) &&
           (pmVar7 = square_monster((chunk *)cave,grid_00), pmVar7 != (monster *)0x0)) {
          wStack_168 = monster_critical(dice_00,local_184,effect._4_4_);
          switch(wStack_168) {
          case L'\0':
            dice_1[1] = '\0';
            dice_1[2] = '\0';
            dice_1[3] = '\0';
            dice_1[4] = '\0';
            break;
          case L'\x01':
            uVar6 = Rand_div(5);
            dice_1._1_4_ = uVar6 + 1;
            break;
          case L'\x02':
            uVar6 = Rand_div(10);
            dice_1._1_4_ = uVar6 + 0xb;
            break;
          case L'\x03':
            uVar6 = Rand_div(0x14);
            dice_1._1_4_ = uVar6 + 0x15;
            break;
          case L'\x04':
            uVar6 = Rand_div(0x1e);
            dice_1._1_4_ = uVar6 + 0x1f;
            break;
          case L'\x05':
            uVar6 = Rand_div(0x28);
            dice_1._1_4_ = uVar6 + 0x29;
            break;
          case L'\x06':
            dice_1[1] = 'd';
            dice_1[2] = '\0';
            dice_1[3] = '\0';
            dice_1[4] = '\0';
            break;
          default:
            dice_1[1] = -0x38;
            dice_1[2] = '\0';
            dice_1[3] = '\0';
            dice_1[4] = '\0';
          }
          if (dice_1._1_4_ != 0) {
            mon_inc_timed(t_mon,L'\x01',dice_1._1_4_,L'\0');
          }
        }
      }
      else {
        to_hit = chance_of_monster_hit(mon,effect_00);
        _Var4 = test_hit(to_hit,t_mon->race->ac);
        if (_Var4) goto LAB_00188f8b;
        _Var4 = monster_is_visible(mon);
        if ((_Var4) && ((pbVar2->miss & 1U) != 0)) {
          msg("%s misses %s.",t_name + 0x48,&grid.y);
        }
      }
      if (((bVar3) &&
          (((local_e6 != 0 || (effect._4_4_ != L'\0')) || (10 < lore_00->blows[local_30].times_seen)
           ))) && (lore_00->blows[local_30].times_seen < 0xff)) {
        lore_00->blows[local_30].times_seen = lore_00->blows[local_30].times_seen + 1;
      }
      pmVar7 = square_monster((chunk *)cave,grid_00);
      if (pmVar7 == (monster *)0x0) break;
    }
    if ((grid.x._3_1_ & 1) != 0) {
      _Var4 = square_isseen((chunk *)cave,mon->grid);
      if (_Var4) {
        add_monster_message(mon,L'4',true);
      }
      strnfmt(local_16d,5,"%d",(ulong)((uint)z_info->max_sight * 2 + 5));
      sVar8 = source_monster(mon->midx);
      origin.which = sVar8.which;
      origin._4_4_ = 0;
      origin.what = sVar8.what;
      effect_simple(L':',origin,local_16d,L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    }
    lore_update(mon->race,lore_00);
    mon_local._7_1_ = true;
  }
  return mon_local._7_1_;
}

Assistant:

bool monster_attack_monster(struct monster *mon, struct monster *t_mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	int rlev = ((mon->race->level >= 1) ? mon->race->level : 1);
	int ap_cnt;
	char m_name[80];
	char t_name[80];
	bool blinked = false;

	/* Not allowed to attack */
	if (rf_has(mon->race->flags, RF_NEVER_BLOW)) return (false);

	/* Get the monster names (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
	monster_desc(t_name, sizeof(t_name), t_mon, MDESC_TARG);

	/* Scan through all blows */
	for (ap_cnt = 0; ap_cnt < z_info->mon_blows_max; ap_cnt++) {
		struct loc grid = t_mon->grid;
		bool visible = monster_is_visible(mon) || (mon->race->light > 0);
		bool obvious = false;

		int damage = 0;
		bool do_stun = false;

		/* Extract the attack infomation */
		struct blow_effect *effect = mon->race->blow[ap_cnt].effect;
		struct blow_method *method = mon->race->blow[ap_cnt].method;
		random_value dice = mon->race->blow[ap_cnt].dice;

		/* No more attacks */
		if (!method) break;

		/* Monster hits monster */
		assert(effect);
		if (streq(effect->name, "NONE") ||
			test_hit(chance_of_monster_hit(mon, effect), t_mon->race->ac)) {
			melee_effect_handler_f effect_handler;

			do_stun = method->stun;

			/* Hack -- assume all attacks are obvious */
			obvious = true;

			/* Roll dice */
			damage = randcalc(dice, rlev, RANDOMISE);

			/* Reduce damage when stunned */
			if (mon->m_timed[MON_TMD_STUN]) {
				damage = (damage * (100 - STUN_DAM_REDUCTION)) / 100;
			}

			/* Perform the actual effect. */
			effect_handler = melee_handler_for_blow_effect(effect->name);
			if (effect_handler != NULL) {
				melee_effect_handler_context_t context = {
					NULL,
					mon,
					t_mon,
					rlev,
					method,
					t_mon->race->ac,
					NULL,
					obvious,
					blinked,
					damage,
					m_name
				};

				effect_handler(&context);

				/* Save any changes made in the handler for later use. */
				obvious = context.obvious;
				blinked = context.blinked;
				damage = context.damage;
			} else {
				msg("ERROR: Effect handler not found for %s.", effect->name);
			}

			/* Handle stun */
			if (do_stun && square_monster(cave, grid)) {
				/* Critical hit (zero if non-critical) */
				int amt, tmp = monster_critical(dice, rlev, damage);

				/* Roll for damage */
				switch (tmp) {
					case 0: amt = 0; break;
					case 1: amt = randint1(5); break;
					case 2: amt = randint1(10) + 10; break;
					case 3: amt = randint1(20) + 20; break;
					case 4: amt = randint1(30) + 30; break;
					case 5: amt = randint1(40) + 40; break;
					case 6: amt = 100; break;
					default: amt = 200; break;
				}

				/* Apply the stun */
				if (amt)
					(void)mon_inc_timed(t_mon, MON_TMD_STUN, amt, 0);
			}
		} else {
			/* Visible monster missed monster, so notify if appropriate. */
			if (monster_is_visible(mon) && method->miss) {
				msg("%s misses %s.", m_name, t_name);
			}
		}

		/* Analyze "visible" monsters only */
		if (visible) {
			/* Count "obvious" attacks (and ones that cause damage) */
			if (obvious || damage || (lore->blows[ap_cnt].times_seen > 10)) {
				/* Count attacks of this type */
				if (lore->blows[ap_cnt].times_seen < UCHAR_MAX)
					lore->blows[ap_cnt].times_seen++;
			}
		}

		/* Skip the other blows if the target has moved or died */
		if (!square_monster(cave, grid)) break;
	}

	/* Blink away */
	if (blinked) {
		char dice[5];

		if (square_isseen(cave, mon->grid)) {
			add_monster_message(mon, MON_MSG_HIT_AND_RUN, true);
		}
		strnfmt(dice, sizeof(dice), "%d", z_info->max_sight * 2 + 5);
		effect_simple(EF_TELEPORT, source_monster(mon->midx), dice, 0, 0, 0, 0, 0, NULL);
	}

	/* Learn lore */
	lore_update(mon->race, lore);

	/* Assume we attacked */
	return (true);
}